

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixderiv.h
# Opt level: O1

double __thiscall
MixDerivs<double>::d2psir_dxidxj__consttaudelta(MixDerivs<double> *this,size_t i,size_t j)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar7;
  
  dVar1 = this->delta;
  dVar2 = this->R;
  dVar3 = this->tau;
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[6])(this->m_ders,0,0);
  dVar5 = d2rhorTr_dxidxj__consttaudelta(this,i,j);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x16])(this->m_ders,i);
  dVar6 = drhorTr_dxi__xj(this,j);
  dVar4 = this->rhorTr;
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x19])(this->m_ders,i,j);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x16])(this->m_ders,j);
  dVar7 = drhorTr_dxi__xj(this,i);
  return (dVar7 * extraout_XMM0_Qa_02 +
         extraout_XMM0_Qa_01 * dVar4 + dVar6 * extraout_XMM0_Qa_00 + dVar5 * extraout_XMM0_Qa) *
         ((dVar1 * dVar2) / dVar3);
}

Assistant:

TYPE d2psir_dxidxj__consttaudelta(std::size_t i, std::size_t j) const {
        return delta*R / tau*(Ar(0, 0)*d2rhorTr_dxidxj__consttaudelta(i, j)
            + m_ders.dalphar_dxi__taudeltaxj(i)*drhorTr_dxi__xj(j)
            + rhorTr*m_ders.d2alphar_dxidxj__consttaudelta(i, j)
            + m_ders.dalphar_dxi__taudeltaxj(j)*drhorTr_dxi__xj(i)
            );
    }